

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O0

void producerThread(void *arg)

{
  deUint32 local_3c;
  uint local_38;
  int local_34;
  deUint32 val;
  int writePos;
  int numToProduce;
  int ndx;
  deRandom random;
  TestBuffer *buffer;
  void *arg_local;
  
  local_34 = 0;
  random._8_8_ = arg;
  deRandom_init((deRandom *)&numToProduce,0x7b);
  for (writePos = 0; writePos < 0x2711; writePos = writePos + 1) {
    if (writePos == 10000) {
      local_38 = 0;
    }
    else {
      local_3c = deRandom_getUint32((deRandom *)&numToProduce);
      if (local_3c == 0) {
        local_3c = 1;
      }
      local_38 = local_3c;
    }
    deSemaphore_decrement(*(deSemaphore *)(random._8_8_ + 0x80));
    *(uint *)(random._8_8_ + (long)local_34 * 4) = local_38;
    local_34 = (local_34 + 1) % 0x20;
    deSemaphore_increment(*(deSemaphore *)(random._8_8_ + 0x88));
    *(uint *)(random._8_8_ + 0x90) = local_38 ^ *(uint *)(random._8_8_ + 0x90);
  }
  return;
}

Assistant:

void producerThread (void* arg)
{
	TestBuffer* buffer = (TestBuffer*)arg;
	deRandom	random;
	int			ndx;
	int			numToProduce	= 10000;
	int			writePos		= 0;

	deRandom_init(&random, 123);

	for (ndx = 0; ndx <= numToProduce; ndx++)
	{
		deUint32 val;

		if (ndx == numToProduce)
		{
			val = 0u; /* End. */
		}
		else
		{
			val = deRandom_getUint32(&random);
			val = val ? val : 1u;
		}

		deSemaphore_decrement(buffer->empty);

		buffer->buffer[writePos] = val;
		writePos = (writePos + 1) % DE_LENGTH_OF_ARRAY(buffer->buffer);

		deSemaphore_increment(buffer->fill);

		buffer->producerHash ^= val;
	}
}